

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# J2CLOpts.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_150::TrivialOnceFunctionCollector::~TrivialOnceFunctionCollector
          (TrivialOnceFunctionCollector *this)

{
  TrivialOnceFunctionCollector *this_local;
  
  ~TrivialOnceFunctionCollector(this);
  operator_delete(this,0x138);
  return;
}

Assistant:

TrivialOnceFunctionCollector(TrivialFunctionMap& trivialFunctionMap)
    : trivialFunctionMap(trivialFunctionMap) {}